

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_class_effect_yx(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  long lVar3;
  long *local_38;
  effect *effect;
  class_spell *spell;
  class_book *book;
  player_class *c;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(int *)((long)pvVar2 + 0x108) < 1) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if ((*(long *)((long)pvVar2 + 0x110) == 0) ||
       (class_max_books < *(wchar_t *)((long)pvVar2 + 0x108))) {
      __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                    ,0xfea,"enum parser_error parse_class_effect_yx(struct parser *)");
    }
    lVar3 = *(long *)((long)pvVar2 + 0x110) + (long)(*(int *)((long)pvVar2 + 0x108) + -1) * 0x20;
    if (*(int *)(lVar3 + 0xc) < 1) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      if ((*(long *)(lVar3 + 0x18) == 0) || (book_max_spells < *(wchar_t *)(lVar3 + 0xc))) {
        __assert_fail("book->spells && book->num_spells <= book_max_spells",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                      ,0xff0,"enum parser_error parse_class_effect_yx(struct parser *)");
      }
      local_38 = *(long **)(*(long *)(lVar3 + 0x18) + (long)(*(int *)(lVar3 + 0xc) + -1) * 0x38 +
                           0x10);
      if (local_38 == (long *)0x0) {
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
      else {
        for (; *local_38 != 0; local_38 = (long *)*local_38) {
        }
        wVar1 = parser_getint(p,"y");
        *(wchar_t *)(local_38 + 3) = wVar1;
        wVar1 = parser_getint(p,"x");
        *(wchar_t *)((long)local_38 + 0x1c) = wVar1;
        p_local._4_4_ = PARSE_ERROR_NONE;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_class_effect_yx(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;
	struct effect *effect;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	/* If there is no effect, assume that this is human and not parser error. */
	effect = spell->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;
	effect->y = parser_getint(p, "y");
	effect->x = parser_getint(p, "x");

	return PARSE_ERROR_NONE;
}